

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

bool __thiscall smf::MidiFile::writeBase64(MidiFile *this,ostream *out,int width)

{
  size_t in_RCX;
  void *__buf;
  MidiFile *this_00;
  ulong uVar1;
  ulong uVar2;
  string encoded;
  stringstream raw;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [8];
  MidiFile local_1a0 [3];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  write(this,(int)local_1a8,__buf,in_RCX);
  this_00 = local_1a0;
  std::__cxx11::stringbuf::str();
  base64Encode(&local_1f8,this_00,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (width < 1) {
    std::operator<<(out,(string *)&local_1f8);
  }
  else {
    uVar1 = 0;
    uVar2 = 0;
    if (0 < (int)(uint)local_1f8._M_string_length) {
      uVar2 = (ulong)(uint)local_1f8._M_string_length;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      std::operator<<(out,local_1f8._M_dataplus._M_p[uVar1]);
      if (((int)uVar1 + 1U) % (uint)width == 0) {
        std::operator<<(out,"\n");
      }
    }
    if ((int)((uint)local_1f8._M_string_length + 1) % width != 0) {
      std::operator<<(out,"\n");
    }
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return true;
}

Assistant:

bool MidiFile::writeBase64(std::ostream& out, int width) {
	std::stringstream raw;
	bool status = MidiFile::write(raw);
	if (!status) {
		return status;
	}
	std::string encoded = MidiFile::base64Encode(raw.str());
	if (width <= 0) {
		out << encoded;
		return status;
	}
	int length = (int)encoded.size();
	for (int i=0; i<length; i++) {
		out << encoded[i];
		if ((i + 1) % width == 0) {
			out << "\n";
		}
	}
	if ((length + 1) % width != 0) {
		out << "\n";
	}
	return status;
}